

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Statements.cpp
# Opt level: O3

Statement *
slang::ast::BlockStatement::fromSyntax
          (Compilation *comp,BlockStatementSyntax *syntax,ASTContext *sourceCtx,
          StatementContext *stmtCtx,bool addInitializers)

{
  size_type sVar1;
  pointer ppSVar2;
  SyntaxNode *this;
  Compilation *this_00;
  bool bVar3;
  bool bVar4;
  StatementBlockKind SVar5;
  uint uVar6;
  int iVar7;
  ProceduralBlockSymbol *pPVar8;
  Diagnostic *this_01;
  InvalidStatement *pIVar9;
  StatementSyntax *pSVar10;
  undefined4 extraout_var;
  BlockStatement *pBVar11;
  long lVar12;
  bool bVar13;
  SourceRange SVar14;
  string_view arg;
  ASTContext context;
  SmallVector<const_slang::ast::Statement_*,_5UL> buffer;
  byte local_d4;
  BlockStatement *local_d0;
  bitmask<slang::ast::StatementFlags> *local_c8;
  ulong local_c0;
  BlockStatementSyntax *local_b8;
  Compilation *local_b0;
  ASTContext local_a8;
  undefined1 local_70 [64];
  
  local_a8.assertionInstance = sourceCtx->assertionInstance;
  local_a8.scope.ptr = (sourceCtx->scope).ptr;
  local_a8.lookupIndex = sourceCtx->lookupIndex;
  local_a8._12_4_ = *(undefined4 *)&sourceCtx->field_0xc;
  local_a8.flags.m_bits = (sourceCtx->flags).m_bits;
  local_a8.instanceOrProc = sourceCtx->instanceOrProc;
  local_a8.firstTempVar = sourceCtx->firstTempVar;
  local_a8.randomizeDetails = sourceCtx->randomizeDetails;
  SVar5 = SemanticFacts::getStatementBlockKind(syntax);
  if ((local_a8.flags.m_bits & 0x6000) == 0) {
    if (SVar5 == Sequential) {
      local_d4 = ((byte)(stmtCtx->flags).m_bits & 2) >> 1;
LAB_0028f24a:
      bVar3 = true;
      goto LAB_0028f24f;
    }
    bVar3 = ASTContext::inAlwaysCombLatch(&local_a8);
    if (bVar3) {
      pPVar8 = ASTContext::getProceduralBlock(&local_a8);
      if (pPVar8 == (ProceduralBlockSymbol *)0x0) {
        assert::assertFailed
                  ("proc",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/Kuree[P]hgdb-rtl/extern/slang/source/ast/Statements.cpp"
                   ,0x29d,
                   "static Statement &slang::ast::BlockStatement::fromSyntax(Compilation &, const BlockStatementSyntax &, const ASTContext &, StatementContext &, bool)"
                  );
      }
      SVar14 = parsing::Token::range(&syntax->begin);
      this_01 = ASTContext::addDiag(&local_a8,(DiagCode)0x170008,SVar14);
      arg = SemanticFacts::getProcedureKindStr(pPVar8->procedureKind);
      Diagnostic::operator<<(this_01,arg);
      goto LAB_0028f1cd;
    }
LAB_0028f200:
    uVar6 = (stmtCtx->flags).m_bits;
    local_d4 = (byte)((uVar6 & 2) >> 1);
  }
  else {
    if (SVar5 - JoinAll < 2) {
      SVar14 = parsing::Token::range(&syntax->end);
      ASTContext::addDiag(&local_a8,(DiagCode)0x460008,SVar14);
LAB_0028f1cd:
      local_70._0_8_ = (Statement *)0x0;
      pIVar9 = BumpAllocator::emplace<slang::ast::InvalidStatement,slang::ast::Statement_const*&>
                         (&comp->super_BumpAllocator,(Statement **)local_70);
      return &pIVar9->super_Statement;
    }
    if (SVar5 == JoinNone) {
      local_a8.flags.m_bits = local_a8.flags.m_bits & 0xfffff9fff;
      goto LAB_0028f200;
    }
    uVar6 = (stmtCtx->flags).m_bits;
    local_d4 = (byte)((uVar6 & 2) >> 1);
    if (SVar5 == Sequential) goto LAB_0028f24a;
  }
  (stmtCtx->flags).m_bits = uVar6 | 2;
  bVar3 = false;
LAB_0028f24f:
  local_c8 = &stmtCtx->flags;
  local_70._0_8_ = local_70 + 0x18;
  local_70._8_8_ = 0;
  local_70._16_8_ = 5;
  local_b0 = comp;
  if (addInitializers) {
    Statement::bindScopeInitializers
              (&local_a8,(SmallVectorBase<const_slang::ast::Statement_*> *)local_70);
  }
  sVar1 = (syntax->items).super_span<slang::syntax::SyntaxNode_*,_18446744073709551615UL>.size_;
  local_c0 = (ulong)SVar5;
  local_b8 = syntax;
  if (sVar1 == 0) {
    bVar13 = false;
  }
  else {
    ppSVar2 = (syntax->items).super_span<slang::syntax::SyntaxNode_*,_18446744073709551615UL>.data_;
    lVar12 = 0;
    bVar13 = false;
    do {
      this = *(SyntaxNode **)((long)ppSVar2 + lVar12);
      bVar4 = slang::syntax::StatementSyntax::isKind(this->kind);
      if (bVar4) {
        pSVar10 = slang::syntax::SyntaxNode::as<slang::syntax::StatementSyntax>(this);
        iVar7 = Statement::bind((int)pSVar10,(sockaddr *)&local_a8,(socklen_t)stmtCtx);
        local_d0 = (BlockStatement *)CONCAT44(extraout_var,iVar7);
        SmallVectorBase<slang::ast::Statement_const*>::emplace_back<slang::ast::Statement_const*>
                  ((SmallVectorBase<slang::ast::Statement_const*> *)local_70,(Statement **)&local_d0
                  );
        bVar13 = (bool)(bVar13 | (((BlockStatement *)CONCAT44(extraout_var,iVar7))->super_Statement)
                                 .kind == Invalid);
      }
      lVar12 = lVar12 + 8;
    } while (sVar1 << 3 != lVar12);
  }
  this_00 = local_b0;
  pBVar11 = createBlockStatement
                      (local_b0,(SmallVectorBase<const_slang::ast::Statement_*> *)local_70,
                       (SyntaxNode *)local_b8,(StatementBlockKind)local_c0);
  if (!bVar3 && local_d4 == 0) {
    local_c8->m_bits = local_c8->m_bits & 0x1d;
  }
  if (bVar13) {
    local_d0 = pBVar11;
    pBVar11 = (BlockStatement *)
              BumpAllocator::emplace<slang::ast::InvalidStatement,slang::ast::Statement_const*&>
                        (&this_00->super_BumpAllocator,(Statement **)&local_d0);
  }
  if ((Statement *)local_70._0_8_ == (Statement *)(local_70 + 0x18)) {
    return &pBVar11->super_Statement;
  }
  free((void *)local_70._0_8_);
  return &pBVar11->super_Statement;
}

Assistant:

Statement& BlockStatement::fromSyntax(Compilation& comp, const BlockStatementSyntax& syntax,
                                      const ASTContext& sourceCtx, StatementContext& stmtCtx,
                                      bool addInitializers) {
    ASTContext context = sourceCtx;
    auto blockKind = SemanticFacts::getStatementBlockKind(syntax);
    if (context.flags.has(ASTFlags::Function | ASTFlags::Final)) {
        if (blockKind == StatementBlockKind::JoinAll || blockKind == StatementBlockKind::JoinAny) {
            context.addDiag(diag::TimingInFuncNotAllowed, syntax.end.range());
            return badStmt(comp, nullptr);
        }
        else if (blockKind == StatementBlockKind::JoinNone) {
            // The "function body" flag does not propagate through fork-join_none
            // blocks, as all statements are allowed in those.
            context.flags &= ~ASTFlags::Function & ~ASTFlags::Final;
        }
    }
    else if (blockKind != StatementBlockKind::Sequential && context.inAlwaysCombLatch()) {
        auto proc = context.getProceduralBlock();
        ASSERT(proc);
        context.addDiag(diag::ForkJoinAlwaysComb, syntax.begin.range())
            << SemanticFacts::getProcedureKindStr(proc->procedureKind);
        return badStmt(comp, nullptr);
    }

    bool wasInForkJoin = stmtCtx.flags.has(StatementFlags::InForkJoin);
    if (blockKind != StatementBlockKind::Sequential)
        stmtCtx.flags |= StatementFlags::InForkJoin;

    bool anyBad = false;
    SmallVector<const Statement*> buffer;

    if (addInitializers)
        bindScopeInitializers(context, buffer);

    for (auto item : syntax.items) {
        if (StatementSyntax::isKind(item->kind)) {
            auto& stmt = Statement::bind(item->as<StatementSyntax>(), context, stmtCtx,
                                         /* inList */ true);
            buffer.push_back(&stmt);
            anyBad |= stmt.bad();
        }
    }

    auto result = createBlockStatement(comp, buffer, syntax, blockKind);

    if (blockKind != StatementBlockKind::Sequential && !wasInForkJoin)
        stmtCtx.flags &= ~StatementFlags::InForkJoin;

    if (anyBad)
        return badStmt(comp, result);

    return *result;
}